

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_peer_eviction_tests.cpp
# Opt level: O1

bool __thiscall
net_peer_eviction_tests::IsProtected
          (net_peer_eviction_tests *this,int num_peers,
          function<void_(NodeEvictionCandidate_&)> candidate_setup_fn,
          unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
          *protected_peer_ids,
          unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
          *unprotected_peer_ids,FastRandomContext *random_context)

{
  ulong uVar1;
  size_type sVar2;
  unit_test_log_t *puVar3;
  size_type sVar4;
  undefined8 uVar5;
  undefined4 in_register_00000034;
  long lVar6;
  FastRandomContext *pFVar7;
  unsigned_long *args_1;
  iterator in_R9;
  pointer pNVar8;
  pointer pNVar9;
  long in_FS_OFFSET;
  bool bVar10;
  const_string file;
  const_string msg;
  long local_118;
  begin local_110;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  size_t expected;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> candidates;
  size_t *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  string *local_88;
  unit_test_log_t local_80;
  char *local_78;
  size_t unprotected_count;
  element_type *local_68;
  shared_count sStack_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  lVar6 = CONCAT44(in_register_00000034,num_peers);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar7 = random_context;
  GetRandomNodeEvictionCandidates(&candidates,(int)this,random_context);
  pNVar9 = candidates.
           super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pNVar8 = candidates.
                super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
                _M_impl.super__Vector_impl_data._M_start; pNVar8 != pNVar9; pNVar8 = pNVar8 + 1) {
    if (*(long *)(lVar6 + 0x10) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar5 = std::__throw_bad_function_call();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._0_8_ != &local_48) {
          operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
        }
        boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                  ((entry_value_collector *)local_a8);
        if (candidates.
            super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(candidates.
                          super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)candidates.
                                super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)candidates.
                                super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(uVar5);
        }
      }
      goto LAB_004a5e58;
    }
    (**(code **)(lVar6 + 0x18))(lVar6,pNVar8);
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<NodeEvictionCandidate*,std::vector<NodeEvictionCandidate,std::allocator<NodeEvictionCandidate>>>,FastRandomContext&>
            ((__normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
              )candidates.
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
              )candidates.
               super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
               _M_impl.super__Vector_impl_data._M_finish,random_context);
  uVar1 = ((long)candidates.
                 super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)candidates.
                 super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  expected = uVar1 - (uVar1 >> 1);
  ProtectEvictionCandidatesByRatio(&candidates);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x27;
  file.m_begin = (iterator)&local_e0;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)pFVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  local_110.m_file_name.m_end = (iterator)((ulong)local_110.m_file_name.m_end & 0xffffffffffffff00);
  local_110.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_013d3cb0;
  local_110.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_118 = ((long)candidates.
                     super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)candidates.
                     super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  local_a8._0_8_ = &local_118;
  local_b0 = &expected;
  unprotected_count = CONCAT71(unprotected_count._1_7_,local_118 - expected == 0);
  local_68 = (element_type *)0x0;
  sStack_60.pi_ = (sp_counted_base *)0x0;
  local_80.super_test_observer._vptr_test_observer = (test_observer)(_func_int **)0xed9518;
  local_78 = "";
  local_88 = (string *)local_a8;
  local_98[0] = '\0';
  local_a8._8_8_ = &PTR__lazy_ostream_013d3cf0;
  local_98._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_b0;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013d3cf0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  args_1 = (unsigned_long *)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&unprotected_count,(lazy_ostream *)&local_110,1,2,REQUIRE,0xfcd26b,
             (size_t)&local_80,0x27,local_a8 + 8,"expected",(string *)local_58);
  boost::detail::shared_count::~shared_count(&sStack_60);
  unprotected_count = 0;
  if (candidates.super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      candidates.super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pNVar9 = candidates.
             super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      sVar2 = std::
              _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&protected_peer_ids->_M_h,&pNVar9->id);
      if (sVar2 == 0) {
        sVar4 = std::
                _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&unprotected_peer_ids->_M_h,&pNVar9->id);
        if (sVar4 != 0) {
          unprotected_count = unprotected_count + 1;
        }
      }
      else {
        local_110.m_file_name.m_begin =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
        ;
        local_110.m_file_name.m_end = "";
        local_110.m_line_num = 0x2d;
        puVar3 = boost::unit_test::unit_test_log_t::operator<<
                           (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110);
        boost::unit_test::unit_test_log_t::operator()(&local_80,(log_level)puVar3);
        tinyformat::format<long>
                  ((string *)local_58,"expected candidate to be protected: %d",&pNVar9->id);
        local_98[0] = '\0';
        local_a8._8_8_ = &PTR__lazy_ostream_013d3bb0;
        local_98._8_8_ = boost::unit_test::lazy_ostream::inst;
        local_88 = (string *)local_58;
        boost::unit_test::ut_detail::entry_value_collector::operator<<
                  ((entry_value_collector *)&local_80,(lazy_ostream *)(local_a8 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._0_8_ != &local_48) {
          operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
        }
        boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                  ((entry_value_collector *)&local_80);
      }
      if (sVar2 != 0) goto LAB_004a5d06;
      pNVar9 = pNVar9 + 1;
    } while (pNVar9 != candidates.
                       super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar10 = unprotected_count == (unprotected_peer_ids->_M_h)._M_element_count;
  if (!bVar10) {
    local_110.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_eviction_tests.cpp"
    ;
    local_110.m_file_name.m_end = "";
    local_110.m_line_num = 0x39;
    puVar3 = boost::unit_test::unit_test_log_t::operator<<
                       (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110);
    boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)local_a8,(log_level)puVar3);
    local_80.super_test_observer._vptr_test_observer =
         (test_observer)(unprotected_peer_ids->_M_h)._M_element_count;
    tinyformat::format<unsigned_long,unsigned_long>
              ((string *)local_58,(tinyformat *)"unprotected: expected %d, actual %d",
               (char *)&local_80,&unprotected_count,args_1);
    local_98[0] = '\0';
    local_a8._8_8_ = &PTR__lazy_ostream_013d3bb0;
    local_98._8_8_ = boost::unit_test::lazy_ostream::inst;
    local_88 = (string *)local_58;
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)local_a8,(lazy_ostream *)(local_a8 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &local_48) {
      operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
    }
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)local_a8);
LAB_004a5d06:
    bVar10 = false;
  }
  if (candidates.super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(candidates.
                    super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)candidates.
                          super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)candidates.
                          super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar10;
  }
LAB_004a5e58:
  __stack_chk_fail();
}

Assistant:

bool IsProtected(int num_peers,
                 std::function<void(NodeEvictionCandidate&)> candidate_setup_fn,
                 const std::unordered_set<NodeId>& protected_peer_ids,
                 const std::unordered_set<NodeId>& unprotected_peer_ids,
                 FastRandomContext& random_context)
{
    std::vector<NodeEvictionCandidate> candidates{GetRandomNodeEvictionCandidates(num_peers, random_context)};
    for (NodeEvictionCandidate& candidate : candidates) {
        candidate_setup_fn(candidate);
    }
    std::shuffle(candidates.begin(), candidates.end(), random_context);

    const size_t size{candidates.size()};
    const size_t expected{size - size / 2}; // Expect half the candidates will be protected.
    ProtectEvictionCandidatesByRatio(candidates);
    BOOST_CHECK_EQUAL(candidates.size(), expected);

    size_t unprotected_count{0};
    for (const NodeEvictionCandidate& candidate : candidates) {
        if (protected_peer_ids.count(candidate.id)) {
            // this peer should have been removed from the eviction candidates
            BOOST_TEST_MESSAGE(strprintf("expected candidate to be protected: %d", candidate.id));
            return false;
        }
        if (unprotected_peer_ids.count(candidate.id)) {
            // this peer remains in the eviction candidates, as expected
            ++unprotected_count;
        }
    }

    const bool is_protected{unprotected_count == unprotected_peer_ids.size()};
    if (!is_protected) {
        BOOST_TEST_MESSAGE(strprintf("unprotected: expected %d, actual %d",
                                     unprotected_peer_ids.size(), unprotected_count));
    }
    return is_protected;
}